

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip_encryption_data.c
# Opt level: O1

void test_read_format_7zip_encryption_data(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *a;
  char *v2;
  time_t v2_00;
  int64_t v2_01;
  ssize_t v2_02;
  archive_entry *ae;
  char buff [128];
  archive_entry *local_c0;
  undefined1 local_b8 [136];
  
  extract_reference_file("test_read_format_7zip_encryption.7z");
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                   ,L'&',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_7zip_encryption.7z",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'*',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L',',-1,"ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW",(long)iVar1,
                      "archive_read_has_encrypted_entries(a)",a);
  iVar1 = archive_read_next_header(a,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  mVar3 = archive_entry_mode(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'0',0x81b4,"(AE_IFREG | 0664)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2 = archive_entry_pathname(local_c0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
             ,L'1',"bar.txt","\"bar.txt\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  v2_00 = archive_entry_mtime(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'2',0x5232ffbc,"1379073980",v2_00,"archive_entry_mtime(ae)",(void *)0x0);
  v2_01 = archive_entry_size(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'3',4,"4",v2_01,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_data_encrypted(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'4',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
  wVar2 = archive_entry_is_metadata_encrypted(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'5',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",(void *)0x0)
  ;
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'6',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",a);
  v2_02 = archive_read_data(a,local_b8,0x80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'7',-0x1e,"ARCHIVE_FATAL",v2_02,"archive_read_data(a, buff, sizeof(buff))",
                      (void *)0x0);
  iVar1 = archive_file_count(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'9',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'<',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_filter_code(a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'?',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
  iVar1 = archive_format(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'@',0xe0000,"ARCHIVE_FORMAT_7ZIP",(long)iVar1,"archive_format(a)",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'C',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_7zip_encryption_data.c"
                      ,L'D',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_7zip_encryption_data)
{
	/* This file is password protected (encrypted) with AES-256. The headers
	   are NOT encrypted. Password is "12345678". */
	const char *refname = "test_read_format_7zip_encryption.7z";
	struct archive_entry *ae;
	struct archive *a;
	char buff[128];

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, 
		archive_read_open_filename(a, refname, 10240));

	assertEqualIntA(a, ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW, archive_read_has_encrypted_entries(a));

	/* Verify encrypted file "bar.txt". */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0664), archive_entry_mode(ae));
	assertEqualString("bar.txt", archive_entry_pathname(ae));
	assertEqualInt(1379073980, archive_entry_mtime(ae));
	assertEqualInt(4, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FATAL, archive_read_data(a, buff, sizeof(buff)));

	assertEqualInt(1, archive_file_count(a));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_7ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}